

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void av1_build_prediction_by_left_preds
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **tmp_buf,int *tmp_width,int *tmp_height,
               int *tmp_stride)

{
  uint8_t uVar1;
  int iVar2;
  uint uVar3;
  MB_MODE_INFO **ppMVar4;
  byte bVar5;
  byte op_mi_size;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  MB_MODE_INFO *above_mbmi;
  int iVar10;
  uint uVar11;
  build_prediction_ctxt ctxt;
  
  if (xd->left_available == true) {
    ctxt.mb_to_far_edge = xd->mb_to_bottom_edge;
    ctxt.dcb = (void *)0x0;
    ppMVar4 = xd->mi;
    iVar2 = max_neighbor_obmc[""[(*ppMVar4)->bsize]];
    uVar1 = cm->seq_params->monochrome;
    uVar3 = xd->mi_row;
    lVar6 = (long)xd->mi_stride * (long)(int)uVar3;
    iVar9 = xd->height + uVar3;
    iVar10 = (cm->mi_params).mi_rows;
    if (iVar10 <= iVar9) {
      iVar9 = iVar10;
    }
    iVar10 = 0;
    uVar11 = uVar3;
    ctxt.cm = cm;
    ctxt.tmp_buf = tmp_buf;
    ctxt.tmp_width = tmp_width;
    ctxt.tmp_height = tmp_height;
    ctxt.tmp_stride = tmp_stride;
    while (((int)uVar11 < iVar9 && (iVar10 < iVar2))) {
      above_mbmi = ppMVar4[((long)(int)(xd->mi_stride * uVar11) + -1) - lVar6];
      uVar8 = (ulong)above_mbmi->bsize;
      bVar5 = 0x10;
      uVar7 = uVar11;
      if ((0x2f0bffUL >> (uVar8 & 0x3f) & 1) != 0) {
        if ((0x20005UL >> (uVar8 & 0x3f) & 1) == 0) {
          bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [uVar8];
        }
        else {
          uVar7 = uVar11 & 0xfffffffe;
          above_mbmi = ppMVar4[((long)(int)(xd->mi_stride * (uVar11 | 1)) + -1) - lVar6];
          bVar5 = 2;
        }
      }
      if (((above_mbmi->field_0xa7 & 0x80) != 0) || ('\0' < above_mbmi->ref_frame[0])) {
        iVar10 = iVar10 + 1;
        op_mi_size = xd->height;
        if (bVar5 <= xd->height) {
          op_mi_size = bVar5;
        }
        build_obmc_prediction
                  (xd,uVar7 - uVar3,0,op_mi_size,1,above_mbmi,&ctxt,(uint)(uVar1 == '\0') * 2 + 1);
      }
      uVar11 = uVar7 + bVar5;
    }
  }
  return;
}

Assistant:

void av1_build_prediction_by_left_preds(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                        uint8_t *tmp_buf[MAX_MB_PLANE],
                                        int tmp_width[MAX_MB_PLANE],
                                        int tmp_height[MAX_MB_PLANE],
                                        int tmp_stride[MAX_MB_PLANE]) {
  if (!xd->left_available) return;
  struct build_prediction_ctxt ctxt = {
    cm, tmp_buf, tmp_width, tmp_height, tmp_stride, xd->mb_to_bottom_edge, NULL
  };
  BLOCK_SIZE bsize = xd->mi[0]->bsize;
  foreach_overlappable_nb_left(cm, xd,
                               max_neighbor_obmc[mi_size_high_log2[bsize]],
                               build_obmc_prediction, &ctxt);
}